

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O0

void __thiscall
slang::ast::ForeachConstraint::serializeTo(ForeachConstraint *this,ASTSerializer *serializer)

{
  ASTSerializer *pAVar1;
  bool bVar2;
  ConstantRange *this_00;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_b0 [2];
  byte local_8a;
  allocator<char> local_89;
  string local_88;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  iterator local_58;
  LoopDim *r;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> *__range2;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  ASTSerializer *local_18;
  ASTSerializer *serializer_local;
  ForeachConstraint *this_local;
  
  local_18 = serializer;
  serializer_local = (ASTSerializer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"arrayRef");
  ASTSerializer::write(serializer,(int)local_28._M_len,local_28._M_str,(size_t)this->arrayRef);
  pAVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&__range2,"loopDims");
  ASTSerializer::startArray(pAVar1,___range2);
  __begin2 = (iterator)&this->loopDims;
  __end2 = nonstd::span_lite::
           span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>::begin
                     ((span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>
                       *)__begin2);
  r = nonstd::span_lite::
      span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>::end
                ((span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> *)
                 __begin2);
  for (; __end2 != r; __end2 = __end2 + 1) {
    local_58 = __end2;
    ASTSerializer::startObject(local_18);
    pAVar1 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68,"range");
    bVar2 = std::optional::operator_cast_to_bool((optional *)local_58);
    local_8a = 0;
    if (bVar2) {
      this_00 = std::optional<slang::ConstantRange>::operator->(&local_58->range);
      ConstantRange::toString_abi_cxx11_(&local_88,this_00);
    }
    else {
      std::allocator<char>::allocator();
      local_8a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"[]",&local_89);
    }
    ASTSerializer::write(pAVar1,(int)local_68._M_len,local_68._M_str,(size_t)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    if ((local_8a & 1) != 0) {
      std::allocator<char>::~allocator(&local_89);
    }
    pAVar1 = local_18;
    if (local_58->loopVar != (IteratorSymbol *)0x0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_b0,"var");
      ASTSerializer::write
                (pAVar1,(int)local_b0[0]._M_len,local_b0[0]._M_str,(size_t)local_58->loopVar);
    }
    ASTSerializer::endObject(local_18);
  }
  ASTSerializer::endArray(local_18);
  pAVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c0,"body");
  ASTSerializer::write(pAVar1,(int)local_c0._M_len,local_c0._M_str,(size_t)this->body);
  return;
}

Assistant:

void ForeachConstraint::serializeTo(ASTSerializer& serializer) const {
    serializer.write("arrayRef", arrayRef);

    serializer.startArray("loopDims");
    for (auto& r : loopDims) {
        serializer.startObject();
        serializer.write("range", r.range ? r.range->toString() : "[]");
        if (r.loopVar)
            serializer.write("var", *r.loopVar);
        serializer.endObject();
    }
    serializer.endArray();

    serializer.write("body", body);
}